

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::propagation_failure
          (Proof *this,vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *decisions
          ,NamedVertex *branch_v,NamedVertex *val)

{
  long *plVar1;
  undefined1 auVar2 [16];
  pointer ppVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  type *var;
  pointer ppVar6;
  key_type local_48;
  
  poVar4 = std::operator<<((ostream *)
                           (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t,"* [");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"] propagation failure on ");
  poVar4 = std::operator<<(poVar4,(string *)&branch_v->second);
  poVar4 = std::operator<<(poVar4,"=");
  poVar4 = std::operator<<(poVar4,(string *)&val->second);
  std::operator<<(poVar4,'\n');
  std::operator<<((ostream *)
                  (((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  proof_stream)._M_t,"u ");
  ppVar3 = (decisions->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (ppVar6 = (decisions->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3; ppVar6 = ppVar6 + 1) {
    poVar4 = std::operator<<((ostream *)
                             (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t," 1 ~x");
    auVar2._8_8_ = 0;
    auVar2._0_4_ = ppVar6->first;
    auVar2._4_4_ = ppVar6->second;
    local_48 = (key_type)vpmovsxdq_avx(auVar2);
    pmVar5 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,&local_48);
    std::operator<<(poVar4,(string *)pmVar5);
  }
  std::operator<<((ostream *)
                  (((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  proof_stream)._M_t," >= 1 ;\n");
  plVar1 = &((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

auto Proof::propagation_failure(const vector<pair<int, int>> & decisions, const NamedVertex & branch_v, const NamedVertex & val) -> void
{
    *_imp->proof_stream << "* [" << decisions.size() << "] propagation failure on " << branch_v.second << "=" << val.second << '\n';
    *_imp->proof_stream << "u ";
    for (auto & [var, val] : decisions)
        *_imp->proof_stream << " 1 ~x" << _imp->variable_mappings[pair{var, val}];
    *_imp->proof_stream << " >= 1 ;\n";
    ++_imp->proof_line;
}